

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

mraa_boolean_t mraa_file_exist(char *filename)

{
  bool bVar1;
  undefined1 auStack_58 [4];
  int file_found;
  glob_t results;
  char *filename_local;
  
  _auStack_58 = 0;
  results.gl_stat = (_func_int_char_ptr_stat_ptr *)filename;
  glob(filename,0,(__errfunc *)0x0,(glob_t *)auStack_58);
  bVar1 = _auStack_58 == 1;
  globfree((glob_t *)auStack_58);
  return (uint)bVar1;
}

Assistant:

mraa_boolean_t
mraa_file_exist(const char* filename)
{
    glob_t results;
    results.gl_pathc = 0;
    glob(filename, 0, NULL, &results);
    int file_found = results.gl_pathc == 1;
    globfree(&results);
    return file_found;
}